

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

llama_sampler * llama_sampler_clone(llama_sampler *smpl)

{
  _func_llama_sampler_ptr_llama_sampler_ptr *UNRECOVERED_JUMPTABLE;
  llama_sampler *plVar1;
  
  UNRECOVERED_JUMPTABLE = smpl->iface->clone;
  if (UNRECOVERED_JUMPTABLE != (_func_llama_sampler_ptr_llama_sampler_ptr *)0x0) {
    plVar1 = (*UNRECOVERED_JUMPTABLE)(smpl);
    return plVar1;
  }
  if (smpl->ctx == (llama_sampler_context_t)0x0) {
    plVar1 = llama_sampler_init(smpl->iface,(llama_sampler_context_t)0x0);
    return plVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
             ,0x16b,"the sampler does not support cloning");
}

Assistant:

struct llama_sampler * llama_sampler_clone(const struct llama_sampler * smpl) {
    if (smpl->iface->clone) {
        return smpl->iface->clone(smpl);
    }

    if (smpl->ctx == nullptr) {
        return llama_sampler_init(
            /* .iface = */ smpl->iface,
            /* .ctx   = */ nullptr
        );
    }

    GGML_ABORT("the sampler does not support cloning");
}